

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

Gia_Man_t * Abc_NtkFlattenHierarchyGia2(Abc_Ntk_t *pNtk)

{
  undefined4 in_EAX;
  int iVar1;
  uint uVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar6;
  Abc_Des_t *pAVar7;
  void *pvVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  int Counter;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT44(0xffffffff,in_EAX);
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    Abc_NtkFillTemp(pNtk);
    p = Gia_ManStart(pNtk->vObjs->nSize);
    pcVar3 = Abc_UtilStrsav(pNtk->pName);
    p->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(pNtk->pSpec);
    p->pSpec = pcVar3;
    pVVar4 = Vec_IntAlloc(1000);
    p->vBarBufs = pVVar4;
    for (iVar10 = 0; iVar1 = pNtk->vPis->nSize, iVar10 < iVar1; iVar10 = iVar10 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar10);
      iVar1 = Gia_ManAppendCi(p);
      (pAVar5->field_6).iTemp = iVar1;
    }
    for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar10);
      *(int *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40) =
           (pAVar5->field_6).iTemp;
      iVar1 = pNtk->vPis->nSize;
    }
    pAVar7 = pNtk->pDesign;
    if (pAVar7 == (Abc_Des_t *)0x0) {
      pVVar6 = Abc_NtkDfsWithBoxes(pNtk);
      pNtk->pData = pVVar6;
    }
    else {
      for (iVar10 = 0; iVar10 < pAVar7->vModules->nSize; iVar10 = iVar10 + 1) {
        pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar7->vModules,iVar10);
        pVVar6 = Abc_NtkDfsWithBoxes(pNtk_00);
        pNtk_00->pData = pVVar6;
        pAVar7 = pNtk->pDesign;
      }
    }
    Gia_ManHashAlloc(p);
    Abc_NtkFlattenHierarchyGia2_rec(p,pNtk,(int *)((long)&uStack_28 + 4),p->vBarBufs);
    Gia_ManHashStop(p);
    iVar10 = 0;
    printf("Hierarchy reader flattened %d instances of logic boxes.\n",uStack_28 >> 0x20);
    pAVar7 = pNtk->pDesign;
    if (pAVar7 == (Abc_Des_t *)0x0) {
      Vec_PtrFreeP((Vec_Ptr_t **)&pNtk->pData);
    }
    else {
      for (; iVar10 < pAVar7->vModules->nSize; iVar10 = iVar10 + 1) {
        pvVar8 = Vec_PtrEntry(pAVar7->vModules,iVar10);
        Vec_PtrFreeP((Vec_Ptr_t **)((long)pvVar8 + 0x158));
        pAVar7 = pNtk->pDesign;
      }
    }
    for (iVar10 = 0; iVar1 = pNtk->vPos->nSize, iVar10 < iVar1; iVar10 = iVar10 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar10);
      (pAVar5->field_6).iTemp =
           *(int *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40);
    }
    for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar10);
      Gia_ManAppendCo(p,(pAVar5->field_6).iTemp);
      iVar1 = pNtk->vPos->nSize;
    }
    pVVar4 = p->vBarBufs;
    printf("Vector has %d entries: {",(ulong)(uint)pVVar4->nSize);
    for (iVar10 = 0; iVar10 < pVVar4->nSize; iVar10 = iVar10 + 1) {
      uVar2 = Vec_IntEntry(pVVar4,iVar10);
      printf(" %d",(ulong)uVar2);
    }
    puts(" }");
    pGVar9 = Gia_ManCleanup(p);
    Gia_ManStop(p);
    return pGVar9;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x8e,"Gia_Man_t *Abc_NtkFlattenHierarchyGia2(Abc_Ntk_t *)");
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia2( Abc_Ntk_t * pNtk )
{
    int fUseBufs = 1;
    int fUseInter = 0;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    int i, Counter = -1;
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );
    Abc_NtkFillTemp( pNtk );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);
    if ( fUseBufs )
        pNew->vBarBufs = Vec_IntAlloc( 1000 );

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = fUseInter ? Gia_ManAppendBuf(pNew, pTerm->iTemp) : pTerm->iTemp;

    // create DFS order of nets
    if ( !pNtk->pDesign )
        pNtk->pData = Abc_NtkDfsWithBoxes( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            pModel->pData = Abc_NtkDfsWithBoxes( pModel );

    // call recursively
    Gia_ManHashAlloc( pNew );
    Abc_NtkFlattenHierarchyGia2_rec( pNew, pNtk, &Counter, pNew->vBarBufs );
    Gia_ManHashStop( pNew );
    printf( "Hierarchy reader flattened %d instances of logic boxes.\n", Counter );

    // delete DFS order of nets
    if ( !pNtk->pDesign )
        Vec_PtrFreeP( (Vec_Ptr_t **)&pNtk->pData );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Vec_PtrFreeP( (Vec_Ptr_t **)&pModel->pData );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        pTerm->iTemp = fUseInter ? Gia_ManAppendBuf(pNew, Abc_ObjFanin0(pTerm)->iTemp) : Abc_ObjFanin0(pTerm)->iTemp;
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    // save buffers
    if ( fUseInter )
    {
        Vec_IntPush( pNew->vBarBufs, 0 );
        Vec_IntPush( pNew->vBarBufs, Abc_NtkPiNum(pNtk) );
        Vec_IntPush( pNew->vBarBufs, Gia_ManBufNum(pNew) - Abc_NtkPoNum(pNtk) );
        Vec_IntPush( pNew->vBarBufs, Abc_NtkPoNum(pNtk) );
    }
    if ( fUseBufs )
        Vec_IntPrint( pNew->vBarBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}